

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree_crash747.c
# Opt level: O1

void test_read_format_mtree_crash747(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_conflict *a;
  
  pcVar3 = archive_bzlib_version();
  if (pcVar3 != (char *)0x0) {
    extract_reference_file("test_read_format_mtree_crash747.mtree.bz2");
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree_crash747.c"
                     ,L'+',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_bzip2((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree_crash747.c"
                        ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_bzip2(a)",a);
    wVar2 = archive_read_support_format_mtree((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree_crash747.c"
                        ,L'-',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_mtree(a)",a);
    wVar2 = archive_read_open_filename(a,"test_read_format_mtree_crash747.mtree.bz2",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree_crash747.c"
                        ,L'.',-0x1e,"ARCHIVE_FATAL",(long)wVar2,
                        "archive_read_open_filename(a, reffile, 10240)",a);
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree_crash747.c"
                        ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree_crash747.c"
                 ,L'%');
  test_skipping("This test requires bzlib");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_crash747)
{
	const char *reffile = "test_read_format_mtree_crash747.mtree.bz2";
	struct archive *a;

	if (archive_bzlib_version() == NULL) {
		skipping("This test requires bzlib");
		return;
	}

	extract_reference_file(reffile);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_bzip2(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_mtree(a));
	assertEqualIntA(a, ARCHIVE_FATAL, archive_read_open_filename(a, reffile, 10240));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}